

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agsmock.cpp
# Opt level: O2

void __thiscall AGSMock::GameAborted::GameAborted(GameAborted *this,char *reason)

{
  allocator<char> local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Plugin called \'AbortGame\': ",&local_59);
  std::operator+(&local_58,&local_38,reason);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  *(undefined ***)this = &PTR__runtime_error_00110680;
  return;
}

Assistant:

GameAborted::GameAborted(const char *reason)
	: runtime_error(string("Plugin called 'AbortGame': ") + reason) {}